

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O3

int Dar_ManCutCount(Aig_Man_t *pAig,int *pnCutsK)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar4 = (long)pAig->vObjs->nSize;
  if (lVar4 < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      pvVar1 = pAig->vObjs->pArray[lVar5];
      if (((pvVar1 != (void *)0x0) &&
          (uVar2 = *(ulong *)((long)pvVar1 + 0x18), 0xfffffffd < ((uint)uVar2 & 7) - 7)) &&
         (uVar2 >> 0x38 != 0)) {
        lVar6 = 0;
        do {
          if ((*(uint *)(*(long *)((long)pvVar1 + 0x28) + 4 + lVar6) >> 0x1c & 1) != 0) {
            iVar3 = iVar3 + 1;
          }
          lVar6 = lVar6 + 0x18;
        } while ((uint)(byte)(uVar2 >> 0x38) * 0x18 != (int)lVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4);
  }
  if (pnCutsK != (int *)0x0) {
    *pnCutsK = 0;
  }
  return iVar3;
}

Assistant:

int Dar_ManCutCount( Aig_Man_t * pAig, int * pnCutsK )
{
    Dar_Cut_t * pCut;
    Aig_Obj_t * pObj;
    int i, k, nCuts = 0, nCutsK = 0;
    Aig_ManForEachNode( pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            nCuts++;
            if ( pCut->nLeaves == 4 )
                nCutsK++;
        }
    if ( pnCutsK )
        *pnCutsK = nCutsK;
    return nCuts;
}